

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int seekAndWriteFd(int fd,i64 iOff,void *pBuf,int nBuf,int *piErrno)

{
  int iVar1;
  __off64_t _Var2;
  int *piVar3;
  
  do {
    _Var2 = lseek64(fd,iOff,0);
    if (_Var2 < 0) {
      iVar1 = -1;
      piVar3 = __errno_location();
      break;
    }
    iVar1 = (*aSyscall[0xb].pCurrent)(fd,pBuf,(ulong)(nBuf & 0x1ffff));
    if (-1 < iVar1) {
      return iVar1;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  *piErrno = *piVar3;
  return iVar1;
}

Assistant:

static int seekAndWriteFd(
  int fd,                         /* File descriptor to write to */
  i64 iOff,                       /* File offset to begin writing at */
  const void *pBuf,               /* Copy data from this buffer to the file */
  int nBuf,                       /* Size of buffer pBuf in bytes */
  int *piErrno                    /* OUT: Error number if error occurs */
){
  int rc = 0;                     /* Value returned by system call */

  assert( nBuf==(nBuf&0x1ffff) );
  assert( fd>2 );
  assert( piErrno!=0 );
  nBuf &= 0x1ffff;
  TIMER_START;

#if defined(USE_PREAD)
  do{ rc = (int)osPwrite(fd, pBuf, nBuf, iOff); }while( rc<0 && errno==EINTR );
#elif defined(USE_PREAD64)
  do{ rc = (int)osPwrite64(fd, pBuf, nBuf, iOff);}while( rc<0 && errno==EINTR);
#else
  do{
    i64 iSeek = lseek(fd, iOff, SEEK_SET);
    SimulateIOError( iSeek = -1 );
    if( iSeek<0 ){
      rc = -1;
      break;
    }
    rc = osWrite(fd, pBuf, nBuf);
  }while( rc<0 && errno==EINTR );
#endif

  TIMER_END;
  OSTRACE(("WRITE   %-3d %5d %7lld %llu\n", fd, rc, iOff, TIMER_ELAPSED));

  if( rc<0 ) *piErrno = errno;
  return rc;
}